

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::emit_as(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,EmitType_e type,Tree *t,size_t id,bool error_on_excess)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  Callbacks *pCVar8;
  ulong in_RCX;
  Tree *in_RDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  size_t in_stack_00000088;
  char msg_2 [18];
  char msg_1 [28];
  char msg [27];
  undefined1 in_stack_fffffffffffffe8f;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  Location *in_stack_fffffffffffffeb0;
  Location *this_00;
  undefined8 local_110;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pWStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  size_t local_f0;
  Location local_e8;
  size_t local_c0;
  size_t sStack_b8;
  char *local_b0;
  char local_a8 [24];
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  size_t local_60;
  char local_58 [39];
  byte local_31;
  ulong local_30;
  Tree *local_28;
  int local_1c;
  substr local_10;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_1c = in_ESI;
  bVar5 = Tree::empty(in_RDX);
  if (bVar5) {
    if (local_30 != 0xffffffffffffffff) {
      builtin_strncpy(local_58,"check failed: (id == NONE)",0x1b);
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      pCVar8 = Tree::callbacks(local_28);
      p_Var1 = pCVar8->m_error;
      Location::Location(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         (size_t)in_stack_fffffffffffffe90);
      pCVar8 = Tree::callbacks(local_28);
      LVar2.super_LineCol.line = uStack_78;
      LVar2.super_LineCol.offset = local_80;
      LVar2.super_LineCol.col = local_70;
      LVar2.name.str = (char *)uStack_68;
      LVar2.name.len = local_60;
      (*p_Var1)(local_58,0x1b,LVar2,pCVar8->m_user_data);
    }
    basic_substring<char>::basic_substring(&local_10);
  }
  else {
    sVar7 = Tree::size(local_28);
    if (sVar7 <= local_30) {
      builtin_strncpy(local_a8,"check failed: id < t.siz",0x18);
      in_stack_ffffffffffffff70 = 0x292865;
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      pCVar8 = Tree::callbacks(local_28);
      p_Var1 = pCVar8->m_error;
      Location::Location(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         (size_t)in_stack_fffffffffffffe90);
      pCVar8 = Tree::callbacks(local_28);
      in_stack_fffffffffffffe8f = (undefined1)((ulong)local_e8.name.str >> 0x38);
      LVar3.super_LineCol.line = local_e8.name.len;
      LVar3.super_LineCol.offset = (size_t)local_e8.name.str;
      LVar3.super_LineCol.col = local_c0;
      LVar3.name.str = (char *)sStack_b8;
      LVar3.name.len = (size_t)local_b0;
      (*p_Var1)(local_a8,0x1c,LVar3,pCVar8->m_user_data);
      in_stack_fffffffffffffe90 =
           (WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_e8.name.len;
      in_stack_fffffffffffffe98 = local_c0;
      in_stack_fffffffffffffea0 = sStack_b8;
      in_stack_fffffffffffffea8 = local_b0;
    }
    *(Tree **)(in_RDI + 0x10) = local_28;
    if (local_1c == 0) {
      _emit_yaml((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)msg_2._0_8_,in_stack_00000088);
      pWStack_108 = in_stack_fffffffffffffe90;
    }
    else if (local_1c == 1) {
      _do_visit_json(in_stack_ffffffffffffff78,
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      pWStack_108 = in_stack_fffffffffffffe90;
    }
    else {
      local_e8.super_LineCol.offset._0_1_ = 'u';
      local_e8.super_LineCol.offset._1_1_ = 'n';
      local_e8.super_LineCol.offset._2_1_ = 'k';
      local_e8.super_LineCol.offset._3_1_ = 'n';
      local_e8.super_LineCol.offset._4_1_ = 'o';
      local_e8.super_LineCol.offset._5_1_ = 'w';
      local_e8.super_LineCol.offset._6_1_ = 'n';
      local_e8.super_LineCol.offset._7_1_ = ' ';
      local_e8.super_LineCol.line._0_1_ = 'e';
      local_e8.super_LineCol.line._1_1_ = 'm';
      local_e8.super_LineCol.line._2_1_ = 'i';
      local_e8.super_LineCol.line._3_1_ = 't';
      local_e8.super_LineCol.line._4_1_ = ' ';
      local_e8.super_LineCol.line._5_1_ = 't';
      local_e8.super_LineCol.line._6_1_ = 'y';
      local_e8.super_LineCol.line._7_1_ = 'p';
      local_e8.super_LineCol.col._0_2_ = 0x65;
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      pCVar8 = Tree::callbacks(*(Tree **)(in_RDI + 0x10));
      p_Var1 = pCVar8->m_error;
      this_00 = &local_e8;
      Location::Location(this_00,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
      pCVar8 = Tree::callbacks(*(Tree **)(in_RDI + 0x10));
      in_stack_fffffffffffffe8f = (undefined1)((ulong)local_110 >> 0x38);
      LVar4.super_LineCol.line = (size_t)pWStack_108;
      LVar4.super_LineCol.offset = local_110;
      LVar4.super_LineCol.col = local_100;
      LVar4.name.str = (char *)uStack_f8;
      LVar4.name.len = local_f0;
      (*p_Var1)((char *)this_00,0x12,LVar4,pCVar8->m_user_data);
    }
    local_10 = WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::_get(pWStack_108,(bool)in_stack_fffffffffffffe8f);
  }
  return local_10;
}

Assistant:

substr Emitter<Writer>::emit_as(EmitType_e type, Tree const& t, size_t id, bool error_on_excess)
{
    if(t.empty())
    {
        _RYML_CB_ASSERT(t.callbacks(), id == NONE);
        return {};
    }
    _RYML_CB_CHECK(t.callbacks(), id < t.size());
    m_tree = &t;
    if(type == EMIT_YAML)
        _emit_yaml(id);
    else if(type == EMIT_JSON)
        _do_visit_json(id);
    else
        _RYML_CB_ERR(m_tree->callbacks(), "unknown emit type");
    return this->Writer::_get(error_on_excess);
}